

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void drawTriangleLeft(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double y2;
  double x2;
  double *w;
  double *h;
  double height_local;
  double width_local;
  double y_local;
  double x_local;
  ostream *out_local;
  
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  poVar1 = std::operator<<(out,"M ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height / 2.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + width);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + width);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawTriangleLeft(ostream& out, double x, double y, double width, double height) {
	double& h = height;
	double& w = width;
	double x2 = x+w;
	double y2 = y+h;

	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << "M " << x << " " << y+h/2;
	out << " L " << x2 << " " << y2;
	out << " L " << x2 << " " << y;
	out << " z\"";
	out << "/>\n";
}